

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::Property::Property(Property *this,Attribute *a,bool custom)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  vtable_type *pvVar3;
  
  (this->_attrib)._name._M_dataplus._M_p = (pointer)&(this->_attrib)._name.field_2;
  pcVar2 = (a->_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (a->_name)._M_string_length);
  (this->_attrib)._varying_authored = a->_varying_authored;
  (this->_attrib)._variability = a->_variability;
  (this->_attrib)._type_name._M_dataplus._M_p = (pointer)&(this->_attrib)._type_name.field_2;
  pcVar2 = (a->_type_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_attrib)._type_name,pcVar2,pcVar2 + (a->_type_name)._M_string_length)
  ;
  pvVar3 = (a->_var)._value.v_.vtable;
  (this->_attrib)._var._value.v_.vtable = pvVar3;
  if (pvVar3 != (vtable_type *)0x0) {
    (*pvVar3->copy)((storage_union *)&a->_var,(storage_union *)&(this->_attrib)._var);
  }
  (this->_attrib)._var._blocked = (a->_var)._blocked;
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::vector(&(this->_attrib)._var._ts._samples,&(a->_var)._ts._samples);
  (this->_attrib)._var._ts._dirty = (a->_var)._ts._dirty;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&(this->_attrib)._paths,&a->_paths);
  AttrMetas::AttrMetas(&(this->_attrib)._metas,&a->_metas);
  this->_listOpQual = ResetToExplicit;
  (this->_rel).type = DefineOnly;
  (this->_rel).targetPath._prim_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._prim_part.field_2;
  (this->_rel).targetPath._prim_part._M_string_length = 0;
  (this->_rel).targetPath._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._prop_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._prop_part.field_2;
  (this->_rel).targetPath._prop_part._M_string_length = 0;
  (this->_rel).targetPath._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._variant_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._variant_part.field_2;
  (this->_rel).targetPath._variant_part._M_string_length = 0;
  (this->_rel).targetPath._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._variant_selection_part.field_2;
  (this->_rel).targetPath._variant_selection_part._M_string_length = 0;
  (this->_rel).targetPath._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._variant_part_str.field_2;
  (this->_rel).targetPath._variant_part_str._M_string_length = 0;
  (this->_rel).targetPath._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._element._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._element.field_2;
  (this->_rel).targetPath._element._M_string_length = 0;
  (this->_rel).targetPath._element.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._path_type.has_value_ = false;
  (this->_rel).targetPath._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_rel).targetPath._valid = false;
  (this->_rel)._metas.interpolation.has_value_ = false;
  (this->_rel)._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  (this->_rel)._metas.elementSize.has_value_ = false;
  (this->_rel)._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  (this->_rel)._metas.hidden.has_value_ = false;
  (this->_rel)._metas.hidden.contained = (storage_t<bool>)0x0;
  (this->_rel)._metas.comment.has_value_ = false;
  (this->_rel)._metas.weight.contained = (storage_t<double>)0x0;
  (this->_rel)._metas.connectability.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.bindMaterialAs.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.bindMaterialAs.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.bindMaterialAs.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.bindMaterialAs.contained + 8) = 0;
  p_Var1 = &(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header;
  (this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)((long)&(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->_rel)._metas.comment.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x28) = 0;
  (this->_rel)._metas.customData.has_value_ = false;
  (this->_rel)._metas.weight.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.customData.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 8) = 0;
  (this->_rel)._metas.outputName.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.connectability.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.connectability.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.connectability.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.connectability.contained + 8) = 0;
  *(undefined8 *)&(this->_rel)._metas.outputName.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.outputName.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.outputName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.outputName.contained + 0x18) = 0;
  (this->_rel)._metas.renderType.has_value_ = false;
  (this->_rel)._metas.sdrMetadata.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.renderType.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.renderType.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.renderType.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.renderType.contained + 8) = 0;
  (this->_rel)._metas.displayName.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.sdrMetadata.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 8) = 0;
  (this->_rel)._metas.displayGroup.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.displayName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayName.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.displayName.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayName.contained + 8) = 0;
  (this->_rel)._metas.bindMaterialAs.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.displayGroup.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayGroup.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.displayGroup.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayGroup.contained + 8) = 0;
  *(undefined8 *)
   ((long)&(this->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->_rel)._varying_authored = false;
  (this->_rel)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rel)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_rel)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_prop_value_type_name)._M_dataplus._M_p = (pointer)&(this->_prop_value_type_name).field_2;
  (this->_prop_value_type_name)._M_string_length = 0;
  (this->_prop_value_type_name).field_2._M_local_buf[0] = '\0';
  this->_has_custom = custom;
  this->_type = Attrib;
  return;
}

Assistant:

Property(const Attribute &a, bool custom = false)
      : _attrib(a), _has_custom(custom) {
    _type = Type::Attrib;
  }